

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O0

error arc::builtin_newstring(vector<arc::atom,_std::allocator<arc::atom>_> *vargs,atom *result)

{
  const_reference pvVar1;
  double *pdVar2;
  char *pcVar3;
  allocator<char> local_89;
  string local_88;
  atom local_68;
  int local_44;
  char *pcStack_40;
  int i;
  char *s;
  long lStack_30;
  char c;
  long length;
  long arg_len;
  atom *result_local;
  vector<arc::atom,_std::allocator<arc::atom>_> *vargs_local;
  
  arg_len = (long)result;
  result_local = (atom *)vargs;
  length = std::vector<arc::atom,_std::allocator<arc::atom>_>::size(vargs);
  pvVar1 = std::vector<arc::atom,_std::allocator<arc::atom>_>::operator[]
                     ((vector<arc::atom,_std::allocator<arc::atom>_> *)result_local,0);
  pdVar2 = std::
           get<double,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                     (&pvVar1->val);
  lStack_30 = (long)*pdVar2;
  s._7_1_ = '\0';
  if (length != 1) {
    if (length != 2) {
      return ERROR_ARGS;
    }
    pvVar1 = std::vector<arc::atom,_std::allocator<arc::atom>_>::operator[]
                       ((vector<arc::atom,_std::allocator<arc::atom>_> *)result_local,1);
    pcVar3 = std::
             get<char,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                       (&pvVar1->val);
    s._7_1_ = *pcVar3;
  }
  pcVar3 = (char *)malloc(lStack_30 + 1);
  for (local_44 = 0; local_44 < lStack_30; local_44 = local_44 + 1) {
    pcVar3[local_44] = s._7_1_;
  }
  pcVar3[lStack_30] = '\0';
  pcStack_40 = pcVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar3,&local_89);
  make_string(&local_68,&local_88);
  atom::operator=((atom *)arg_len,&local_68);
  atom::~atom(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return ERROR_OK;
}

Assistant:

error builtin_newstring(const vector<atom>& vargs, atom* result) {
		long arg_len = vargs.size();
		long length = (long)get<double>(vargs[0].val);
		char c = 0;
		char* s;
		switch (arg_len) {
		case 1: break;
		case 2:
			c = get<char>(vargs[1].val);
			break;
		default:
			return ERROR_ARGS;
		}
		s = (char*)malloc((length + 1) * sizeof(char));
		int i;
		for (i = 0; i < length; i++)
			s[i] = c;
		s[length] = 0; /* end of string */
		*result = make_string(s);
		return ERROR_OK;
	}